

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O0

bool P_CheckNodes(MapData *map,bool rebuilt,int buildtime)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  undefined1 local_1a8 [8];
  FNodeBuilder builder;
  FLevel leveldata;
  undefined1 local_48 [8];
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> anchors;
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> polyspots;
  uint endTime;
  uint startTime;
  int i;
  bool loaded;
  bool ret;
  int buildtime_local;
  bool rebuilt_local;
  MapData *map_local;
  
  startTime._3_1_ = false;
  startTime._2_1_ = false;
  i = buildtime;
  if ((!rebuilt) && (bVar1 = P_CheckForGLNodes(), !bVar1)) {
    startTime._3_1_ = true;
    for (endTime = 0; (int)endTime < numsubsectors; endTime = endTime + 1) {
      gamesubsectors[(int)endTime].sector =
           (gamesubsectors[(int)endTime].firstline)->sidedef->sector;
    }
    nodes = (node_t *)0x0;
    numnodes = 0;
    subsectors = (subsector_t *)0x0;
    numsubsectors = 0;
    if ((segs != (seg_t *)0x0) && (segs != (seg_t *)0x0)) {
      operator_delete__(segs);
    }
    segs = (seg_t *)0x0;
    numsegs = 0;
    startTime._2_1_ = P_LoadGLNodes(map);
    if (!startTime._2_1_) {
      uVar2 = I_FPSTime();
      TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::TArray
                ((TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *)&anchors.Most);
      TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::TArray
                ((TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *)local_48);
      P_GetPolySpots(map,(TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *)&anchors.Most
                     ,(TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *)local_48);
      builder._264_8_ = vertexes;
      FNodeBuilder::FLevel::FindMapBounds((FLevel *)&builder.GLNodes);
      FNodeBuilder::FNodeBuilder
                ((FNodeBuilder *)local_1a8,(FLevel *)&builder.GLNodes,
                 (TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *)&anchors.Most,
                 (TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *)local_48,true);
      if (vertexes != (vertex_t *)0x0) {
        operator_delete__(vertexes);
      }
      FNodeBuilder::Extract
                ((FNodeBuilder *)local_1a8,&nodes,&numnodes,&segs,&glsegextras,&numsegs,&subsectors,
                 &numsubsectors,&vertexes,&numvertexes);
      uVar3 = I_FPSTime();
      DPrintf(3,"BSP generation took %.3f sec (%d segs)\n",(double)(uVar3 - uVar2) * 0.001,
              (ulong)(uint)numsegs);
      i = uVar3 - uVar2;
      FNodeBuilder::~FNodeBuilder((FNodeBuilder *)local_1a8);
      TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::~TArray
                ((TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *)local_48);
      TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::~TArray
                ((TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *)&anchors.Most);
    }
  }
  if (startTime._2_1_ == false) {
    if (((level.maptype == MAPTYPE_BUILD) ||
        (bVar1 = FBoolCVar::operator_cast_to_bool(&gl_cachenodes), !bVar1)) ||
       (fVar4 = FFloatCVar::operator_cast_to_float(&gl_cachetime), (float)i / 1000.0 < fVar4)) {
      DPrintf(3,"Not caching nodes (time = %f)\n",(double)((float)i / 1000.0));
    }
    else {
      DPrintf(3,"Caching nodes\n");
      CreateCachedNodes(map);
    }
  }
  if (gamenodes == (node_t *)0x0) {
    gamenodes = nodes;
    numgamenodes = numnodes;
    gamesubsectors = subsectors;
    numgamesubsectors = numsubsectors;
  }
  return startTime._3_1_;
}

Assistant:

bool P_CheckNodes(MapData * map, bool rebuilt, int buildtime)
{
	bool ret = false;
	bool loaded = false;

	// If the map loading code has performed a node rebuild we don't need to check for it again.
	if (!rebuilt && !P_CheckForGLNodes())
	{
		ret = true;	// we are not using the level's original nodes if we get here.
		for (int i = 0; i < numsubsectors; i++)
		{
			gamesubsectors[i].sector = gamesubsectors[i].firstline->sidedef->sector;
		}

		nodes = NULL;
		numnodes = 0;
		subsectors = NULL;
		numsubsectors = 0;
		if (segs) delete [] segs;
		segs = NULL;
		numsegs = 0;

		// Try to load GL nodes (cached or GWA)
		loaded = P_LoadGLNodes(map);
		if (!loaded)
		{
			// none found - we have to build new ones!
			unsigned int startTime, endTime;

			startTime = I_FPSTime ();
			TArray<FNodeBuilder::FPolyStart> polyspots, anchors;
			P_GetPolySpots (map, polyspots, anchors);
			FNodeBuilder::FLevel leveldata =
			{
				vertexes, numvertexes,
				sides, numsides,
				lines, numlines,
				0, 0, 0, 0
			};
			leveldata.FindMapBounds ();
			FNodeBuilder builder (leveldata, polyspots, anchors, true);
			delete[] vertexes;
			builder.Extract (nodes, numnodes,
				segs, glsegextras, numsegs,
				subsectors, numsubsectors,
				vertexes, numvertexes);
			endTime = I_FPSTime ();
			DPrintf (DMSG_NOTIFY, "BSP generation took %.3f sec (%d segs)\n", (endTime - startTime) * 0.001, numsegs);
			buildtime = endTime - startTime;
		}
	}

	if (!loaded)
	{
#ifdef DEBUG
		// Building nodes in debug is much slower so let's cache them only if cachetime is 0
		buildtime = 0;
#endif
		if (level.maptype != MAPTYPE_BUILD && gl_cachenodes && buildtime/1000.f >= gl_cachetime)
		{
			DPrintf(DMSG_NOTIFY, "Caching nodes\n");
			CreateCachedNodes(map);
		}
		else
		{
			DPrintf(DMSG_NOTIFY, "Not caching nodes (time = %f)\n", buildtime/1000.f);
		}
	}

	if (!gamenodes)
	{
		gamenodes = nodes;
		numgamenodes = numnodes;
		gamesubsectors = subsectors;
		numgamesubsectors = numsubsectors;
	}
	return ret;
}